

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

object * gear_object_for_use(player *p,object *obj,wchar_t num,_Bool message,_Bool *none_left)

{
  wchar_t *pwVar1;
  byte *pbVar2;
  long *plVar3;
  ulong uVar4;
  artifact *paVar5;
  player_upkeep *ppVar6;
  wchar_t amt;
  char cVar7;
  _Bool _Var8;
  int16_t iVar9;
  uint16_t uVar10;
  wchar_t wVar11;
  object *poVar12;
  ushort uVar13;
  uint32_t mode;
  long lVar14;
  char *fmt;
  object *first_remainder;
  char name [80];
  
  first_remainder = (object *)0x0;
  cVar7 = gear_to_label(p,obj);
  paVar5 = obj->known->artifact;
  wVar11 = (wchar_t)obj->number;
  amt = num;
  if (wVar11 < num) {
    amt = wVar11;
  }
  if (num < wVar11) {
    poVar12 = object_split(obj,amt);
    iVar9 = object_weight_one(obj);
    pwVar1 = &p->upkeep->total_weight;
    *pwVar1 = *pwVar1 - iVar9 * amt;
    if (message) {
      lVar14 = 0;
      do {
        if ((ulong)(p->body).count * 0x20 + 0x20 == lVar14 + 0x20) {
          _Var8 = tval_can_have_charges(obj);
          if (((!_Var8) && (_Var8 = tval_is_rod(obj), !_Var8)) && (obj->timeout < 1)) {
            uVar10 = object_pack_total(p,obj,false,&first_remainder);
            if (uVar10 < first_remainder->number) {
              __assert_fail("total >= first_remainder->number",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                            ,0x231,
                            "struct object *gear_object_for_use(struct player *, struct object *, int, _Bool, _Bool *)"
                           );
            }
            if (uVar10 == first_remainder->number) {
              first_remainder = (object *)0x0;
            }
            goto LAB_0018ce5c;
          }
          break;
        }
        plVar3 = (long *)((long)&((p->body).slots)->obj + lVar14);
        lVar14 = lVar14 + 0x20;
      } while ((object *)*plVar3 != obj);
      uVar10 = (uint16_t)obj->number;
LAB_0018ce5c:
      object_desc(name,0x50,obj,(uint)uVar10 << 0x10 | 0x443,p);
    }
  }
  else {
    if (message) {
      if (paVar5 == (artifact *)0x0) {
        lVar14 = 0;
        do {
          if ((ulong)(p->body).count * 0x20 + 0x20 == lVar14 + 0x20) {
            _Var8 = tval_can_have_charges(obj);
            if (((!_Var8) && (_Var8 = tval_is_rod(obj), !_Var8)) && (obj->timeout < 1)) {
              uVar10 = object_pack_total(p,obj,false,&first_remainder);
              wVar11 = (wchar_t)uVar10;
              goto LAB_0018ced9;
            }
            break;
          }
          plVar3 = (long *)((long)&((p->body).slots)->obj + lVar14);
          lVar14 = lVar14 + 0x20;
        } while ((object *)*plVar3 != obj);
        wVar11 = (wchar_t)obj->number;
LAB_0018ced9:
        if (wVar11 < amt) {
          __assert_fail("total >= num",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                        ,0x250,
                        "struct object *gear_object_for_use(struct player *, struct object *, int, _Bool, _Bool *)"
                       );
        }
        uVar13 = (short)wVar11 - (short)amt;
        if ((uVar13 == 0) || (uVar13 <= first_remainder->number)) {
          first_remainder = (object *)0x0;
        }
        mode = (uint)uVar13 << 0x10 | 0x443;
      }
      else {
        mode = 0x13;
      }
      object_desc(name,0x50,obj,mode,p);
    }
    gear_excise_object(p,obj);
    *none_left = true;
    _Var8 = tracked_object_is(p->upkeep,obj);
    if (_Var8) {
      track_object(p->upkeep,(object *)0x0);
    }
    cmd_disable_repeat();
    poVar12 = obj;
  }
  ppVar6 = p->upkeep;
  uVar4._0_4_ = ppVar6->notice;
  uVar4._4_4_ = ppVar6->update;
  ppVar6->notice = (int)(uVar4 | 0x100000001);
  ppVar6->update = (int)((uVar4 | 0x100000001) >> 0x20);
  pbVar2 = (byte *)((long)&ppVar6->redraw + 2);
  *pbVar2 = *pbVar2 | 6;
  if (message) {
    if (paVar5 == (artifact *)0x0) {
      if (first_remainder == (object *)0x0) {
        fmt = "You have %s (%c).";
      }
      else {
        cVar7 = gear_to_label(p,first_remainder);
        fmt = "You have %s (1st %c).";
      }
    }
    else {
      fmt = "You no longer have the %s (%c).";
    }
    msg(fmt,name,(ulong)(uint)(int)cVar7);
  }
  return poVar12;
}

Assistant:

struct object *gear_object_for_use(struct player *p, struct object *obj,
	int num, bool message, bool *none_left)
{
	struct object *usable;
	struct object *first_remainder = NULL;
	char name[80];
	char label = gear_to_label(p, obj);
	bool artifact = (obj->known->artifact != NULL);

	/* Bounds check */
	num = MIN(num, obj->number);

	/* Split off a usable object if necessary */
	if (obj->number > num) {
		usable = object_split(obj, num);

		/* Change the weight */
		p->upkeep->total_weight -= num * object_weight_one(obj);

		if (message) {
			uint16_t total;

			/*
			 * Don't show aggregate total in pack if equipped or
			 * if the description could have a number of charges
			 * or recharging notice specific to the stack (not
			 * aggregating those quantities so there would be
			 * confusion if aggregating the count).
			 */
			if (object_is_equipped(p->body, obj)
					|| tval_can_have_charges(obj)
					|| tval_is_rod(obj)
					|| obj->timeout > 0) {
				total = obj->number;
			} else {
				total = object_pack_total(p, obj, false,
					&first_remainder);
				assert(total >= first_remainder->number);
				if (total == first_remainder->number) {
					first_remainder = NULL;
				}
			}
			object_desc(name, sizeof(name), obj,
				ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
				(total << 16), p);
		}
	} else {
		if (message) {
			if (artifact) {
				object_desc(name, sizeof(name), obj,
					ODESC_FULL | ODESC_SINGULAR, p);
			} else {
				uint16_t total;

				/*
				 * Use same logic as above for showing an
				 * aggregate total.
				 */
				if (object_is_equipped(p->body, obj)
						|| tval_can_have_charges(obj)
						|| tval_is_rod(obj)
						|| obj->timeout > 0) {
					total = obj->number;
				} else {
					total = object_pack_total(p, obj,
						false, &first_remainder);
				}

				assert(total >= num);
				total -= num;
				if (!total || total <= first_remainder->number) {
					first_remainder = NULL;
				}
				object_desc(name, sizeof(name), obj,
					ODESC_PREFIX | ODESC_FULL |
					ODESC_ALTNUM | (total << 16), p);
			}
		}

		/* We're using the entire stack */
		usable = obj;
		gear_excise_object(p, usable);
		*none_left = true;

		/* Stop tracking item */
		if (tracked_object_is(p->upkeep, obj))
			track_object(p->upkeep, NULL);

		/* Inventory has changed, so disable repeat command */
		cmd_disable_repeat();
	}

	/* Housekeeping */
	p->upkeep->update |= (PU_BONUS);
	p->upkeep->notice |= (PN_COMBINE);
	p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	/* Print a message if desired */
	if (message) {
		if (artifact) {
			msg("You no longer have the %s (%c).", name, label);
		} else if (first_remainder) {
			label = gear_to_label(p, first_remainder);
			msg("You have %s (1st %c).", name, label);
		} else {
			msg("You have %s (%c).", name, label);
		}
	}

	return usable;
}